

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O0

vector<wasm::Type,_std::allocator<wasm::Type>_> * __thiscall
wasm::SExpressionWasmBuilder::parseResults
          (vector<wasm::Type,_std::allocator<wasm::Type>_> *__return_storage_ptr__,
          SExpressionWasmBuilder *this,Element *s)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  Element *s_00;
  IString str;
  value_type local_58 [3];
  ulong local_40;
  size_t i;
  Element *local_30;
  size_t local_28;
  Element *local_20;
  Element *s_local;
  SExpressionWasmBuilder *this_local;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *types;
  
  local_30 = RESULT;
  local_28 = DAT_027e5780;
  str.str._M_str = &RESULT->isList_;
  str.str._M_len = DAT_027e5780;
  local_20 = s;
  s_local = (Element *)this;
  this_local = (SExpressionWasmBuilder *)__return_storage_ptr__;
  bVar2 = elementStartsWith((wasm *)s,RESULT,str);
  if (bVar2) {
    i._7_1_ = 0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(__return_storage_ptr__);
    for (local_40 = 1; uVar1 = local_40, sVar3 = Element::size(local_20), uVar1 < sVar3;
        local_40 = local_40 + 1) {
      s_00 = Element::operator[](local_20,(uint)local_40);
      local_58[0].id = (uintptr_t)elementToType(this,s_00);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                (__return_storage_ptr__,local_58);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("elementStartsWith(s, RESULT)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-s-parser.cpp"
                ,0x284,"std::vector<Type> wasm::SExpressionWasmBuilder::parseResults(Element &)");
}

Assistant:

std::vector<Type> SExpressionWasmBuilder::parseResults(Element& s) {
  assert(elementStartsWith(s, RESULT));
  std::vector<Type> types;
  for (size_t i = 1; i < s.size(); i++) {
    types.push_back(elementToType(*s[i]));
  }
  return types;
}